

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O2

void testOptimized(string *tempDir)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\nTesting optimized code path for rgb(a) images-- 2048x1152 (alignment respected) UNCOMPRESSED"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tNON-OPTIMIZABLE file");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator+(&local_30,tempDir,"imf_optimized_aces_rgb.exr");
  remove(local_30._M_dataplus._M_p);
  anon_unknown.dwarf_227985::writeFile
            (local_30._M_dataplus._M_p,0x47f,0x7ff,IMAGE_TYPE_OTHER,false,NO_COMPRESSION);
  anon_unknown.dwarf_227985::readValidateFile
            (local_30._M_dataplus._M_p,0x47f,0x7ff,IMAGE_TYPE_OTHER,false);
  remove(local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tALIGNED -- MONO -- NO COMPRESSION");
  std::endl<char,std::char_traits<char>>(poVar1);
  anon_unknown.dwarf_227985::testAllCombinations(true,false,NO_COMPRESSION,tempDir);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tUNALIGNED -- MONO -- NO COMPRESSION");
  std::endl<char,std::char_traits<char>>(poVar1);
  anon_unknown.dwarf_227985::testAllCombinations(false,false,NO_COMPRESSION,tempDir);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tALIGNED -- MONO -- ZIP COMPRESSION");
  std::endl<char,std::char_traits<char>>(poVar1);
  anon_unknown.dwarf_227985::testAllCombinations(true,false,ZIP_COMPRESSION,tempDir);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tUNALIGNED -- MONO -- ZIP COMPRESSION");
  std::endl<char,std::char_traits<char>>(poVar1);
  anon_unknown.dwarf_227985::testAllCombinations(false,false,ZIP_COMPRESSION,tempDir);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tALIGNED -- STEREO -- NO COMPRESSION");
  std::endl<char,std::char_traits<char>>(poVar1);
  anon_unknown.dwarf_227985::testAllCombinations(true,true,NO_COMPRESSION,tempDir);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tUNALIGNED -- STEREO -- NO COMPRESSION");
  std::endl<char,std::char_traits<char>>(poVar1);
  anon_unknown.dwarf_227985::testAllCombinations(false,true,NO_COMPRESSION,tempDir);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tALIGNED -- STEREO -- ZIP COMPRESSION");
  std::endl<char,std::char_traits<char>>(poVar1);
  anon_unknown.dwarf_227985::testAllCombinations(true,true,ZIP_COMPRESSION,tempDir);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tUNALIGNED -- STEREO -- ZIP COMPRESSION");
  std::endl<char,std::char_traits<char>>(poVar1);
  anon_unknown.dwarf_227985::testAllCombinations(false,true,ZIP_COMPRESSION,tempDir);
  poVar1 = std::operator<<((ostream *)&std::cout,"RGB(A) files validation complete \n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
testOptimized (const std::string& tempDir)
{
    try
    {
        // Test all combinations
        // Aligned file with no compression
        // Unaligned file with no compression
        // Aligned file with zip compression
        // Unaligned file with zip compression
        //
        // Other algorithms are not necessary because we are not testing
        // compression but whetherthe optimized readPixels() code works
        // with a compressed file.
        // MONO
        cout << "\nTesting optimized code path for rgb(a) images-- "
                "2048x1152 (alignment respected) UNCOMPRESSED"
             << endl;

        cout << "\tNON-OPTIMIZABLE file" << endl;
        testNonOptimized (tempDir);

        cout << "\tALIGNED -- MONO -- NO COMPRESSION" << endl;
        testAllCombinations (true, false, NO_COMPRESSION, tempDir);

        cout << "\tUNALIGNED -- MONO -- NO COMPRESSION" << endl;
        testAllCombinations (false, false, NO_COMPRESSION, tempDir);

        cout << "\tALIGNED -- MONO -- ZIP COMPRESSION" << endl;
        testAllCombinations (true, false, ZIP_COMPRESSION, tempDir);

        cout << "\tUNALIGNED -- MONO -- ZIP COMPRESSION" << endl;
        testAllCombinations (false, false, ZIP_COMPRESSION, tempDir);

        //// STEREO
        cout << "\tALIGNED -- STEREO -- NO COMPRESSION" << endl;
        testAllCombinations (true, true, NO_COMPRESSION, tempDir);

        cout << "\tUNALIGNED -- STEREO -- NO COMPRESSION" << endl;
        testAllCombinations (false, true, NO_COMPRESSION, tempDir);

        cout << "\tALIGNED -- STEREO -- ZIP COMPRESSION" << endl;
        testAllCombinations (true, true, ZIP_COMPRESSION, tempDir);

        cout << "\tUNALIGNED -- STEREO -- ZIP COMPRESSION" << endl;
        testAllCombinations (false, true, ZIP_COMPRESSION, tempDir);

        cout << "RGB(A) files validation complete \n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}